

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

void RegisterFeeRPCCommands(CRPCTable *t)

{
  int iVar1;
  CRPCCommand *pcmd;
  long lVar2;
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff88;
  string local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterFeeRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterFeeRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_48,"util",(allocator<char> *)&stack0xffffffffffffff97);
      CRPCCommand::CRPCCommand
                (RegisterFeeRPCCommands::commands,in_stack_ffffffffffffff88,
                 (RpcMethodFnType)local_48);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffff98,"hidden",
                 (allocator<char> *)&stack0xffffffffffffff96);
      CRPCCommand::CRPCCommand
                (RegisterFeeRPCCommands::commands + 1,in_stack_ffffffffffffff88,
                 (RpcMethodFnType)&stack0xffffffffffffff98);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
      std::__cxx11::string::~string(local_48);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterFeeRPCCommands(CRPCTable&)::commands);
    }
  }
  pcmd = RegisterFeeRPCCommands::commands;
  for (lVar2 = 0x100; lVar2 != 0; lVar2 = lVar2 + -0x80) {
    CRPCTable::appendCommand(t,&pcmd->name,pcmd);
    pcmd = pcmd + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterFeeRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"util", &estimatesmartfee},
        {"hidden", &estimaterawfee},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}